

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O3

void ma_device_sink_info_callback
               (ma_pa_context *pPulseContext,ma_pa_sink_info *pInfo,wchar_t endOfList,
               void *pUserData)

{
  if (pInfo == (ma_pa_sink_info *)0x0 || L'\0' < endOfList) {
    return;
  }
  if (pUserData != (void *)0x0) {
    memcpy(pUserData,pInfo,0x1a0);
    return;
  }
  __assert_fail("pInfoOut != ((void*)0)",
                "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                ,0x442d,
                "void ma_device_sink_info_callback(ma_pa_context *, const ma_pa_sink_info *, int, void *)"
               );
}

Assistant:

static void ma_device_sink_info_callback(ma_pa_context* pPulseContext, const ma_pa_sink_info* pInfo, int endOfList, void* pUserData)
{
    ma_pa_sink_info* pInfoOut;

    if (endOfList > 0) {
        return;
    }

    /*
    There has been a report that indicates that pInfo can be null which results
    in a null pointer dereference below. We'll check for this for safety.
    */
    if (pInfo == NULL) {
        return;
    }

    pInfoOut = (ma_pa_sink_info*)pUserData;
    MA_ASSERT(pInfoOut != NULL);

    *pInfoOut = *pInfo;

    (void)pPulseContext; /* Unused. */
}